

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string *psVar4;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  char *colon;
  string format;
  char *gtest_output_flag;
  string s;
  FilePath *in_stack_fffffffffffffcc8;
  FilePath *in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  FilePath *in_stack_fffffffffffffce0;
  allocator *paVar5;
  FilePath *in_stack_fffffffffffffd20;
  FilePath *in_stack_fffffffffffffd28;
  string *this;
  FilePath *in_stack_fffffffffffffd68;
  FilePath local_258;
  allocator local_231;
  string local_230 [71];
  allocator local_1e9;
  string local_1e8 [40];
  char *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  FilePath *in_stack_fffffffffffffe50;
  FilePath *in_stack_fffffffffffffe58;
  allocator local_181;
  string local_180 [32];
  FilePath local_160;
  undefined4 local_140;
  allocator local_139;
  string local_138 [71];
  allocator local_f1;
  string local_f0 [64];
  FilePath local_b0;
  char *local_90;
  allocator local_81;
  string local_80 [48];
  string local_50 [32];
  char *local_30;
  string local_28 [40];
  
  this = local_28;
  std::__cxx11::string::string(this,(string *)FLAGS_gtest_output_abi_cxx11_);
  local_30 = (char *)std::__cxx11::string::c_str();
  GetOutputFormat_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"xml",&local_81);
    std::__cxx11::string::operator=(local_50,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  local_90 = strchr(local_30,0x3a);
  if (local_90 == (char *)0x0) {
    UnitTest::GetInstance();
    pcVar3 = UnitTest::original_working_dir((UnitTest *)0x13090a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,pcVar3,&local_f1);
    FilePath::FilePath(in_stack_fffffffffffffce0,
                       (string *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    paVar5 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"test_detail",paVar5);
    FilePath::FilePath(in_stack_fffffffffffffce0,
                       (string *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    std::__cxx11::string::c_str();
    FilePath::MakeFileName
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe40);
    psVar4 = FilePath::string_abi_cxx11_(&local_b0);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
    FilePath::~FilePath((FilePath *)0x1309fd);
    FilePath::~FilePath((FilePath *)0x130a0a);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    FilePath::~FilePath((FilePath *)0x130a31);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    local_140 = 1;
  }
  else {
    pcVar3 = local_90 + 1;
    paVar5 = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,pcVar3,paVar5);
    FilePath::FilePath(in_stack_fffffffffffffce0,
                       (string *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    bVar1 = FilePath::IsAbsolutePath((FilePath *)0x130bd5);
    if (!bVar1) {
      UnitTest::GetInstance();
      pcVar3 = UnitTest::original_working_dir((UnitTest *)0x130bff);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,pcVar3,&local_1e9);
      FilePath::FilePath(in_stack_fffffffffffffce0,
                         (string *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
      in_stack_fffffffffffffce0 = (FilePath *)(local_90 + 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,(char *)in_stack_fffffffffffffce0,&local_231);
      FilePath::FilePath(in_stack_fffffffffffffce0,
                         (string *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
      FilePath::ConcatPaths(in_stack_fffffffffffffd68,(FilePath *)this);
      FilePath::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      FilePath::~FilePath((FilePath *)0x130cdb);
      FilePath::~FilePath((FilePath *)0x130ce8);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      FilePath::~FilePath((FilePath *)0x130d0f);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
    bVar1 = FilePath::IsDirectory(in_stack_fffffffffffffce0);
    if (bVar1) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      std::__cxx11::string::c_str();
      FilePath::GenerateUniqueFileName
                (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,(char *)paVar5);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
      FilePath::~FilePath((FilePath *)0x130f0e);
      psVar4 = FilePath::string_abi_cxx11_(&local_258);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
      local_140 = 1;
      FilePath::~FilePath((FilePath *)0x130f4c);
    }
    else {
      psVar4 = FilePath::string_abi_cxx11_(&local_160);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
      local_140 = 1;
    }
    FilePath::~FilePath((FilePath *)0x130fc4);
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}